

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O0

void __thiscall
bssl::DTLSTimer::StartMicroseconds(DTLSTimer *this,OPENSSL_timeval now,uint64_t microseconds)

{
  ulong local_30;
  uint64_t seconds;
  uint64_t microseconds_local;
  DTLSTimer *this_local;
  OPENSSL_timeval now_local;
  
  local_30 = microseconds / 1000000;
  now_local.tv_sec._0_4_ = now.tv_usec + (int)(microseconds % 1000000);
  if (999999 < (uint)now_local.tv_sec) {
    now_local.tv_sec._0_4_ = (uint)now_local.tv_sec - 1000000;
    local_30 = local_30 + 1;
  }
  if (-local_30 - 1 < now.tv_sec) {
    Stop(this);
  }
  else {
    (this->expire_time_).tv_sec = local_30 + now.tv_sec;
    *(ulong *)&(this->expire_time_).tv_usec =
         CONCAT44(now_local.tv_sec._4_4_,(uint)now_local.tv_sec);
  }
  return;
}

Assistant:

void DTLSTimer::StartMicroseconds(OPENSSL_timeval now, uint64_t microseconds) {
  uint64_t seconds = microseconds / 1000000;
  microseconds %= 1000000;

  now.tv_usec += microseconds;
  if (now.tv_usec >= 1000000) {
    now.tv_usec -= 1000000;
    seconds++;
  }

  if (now.tv_sec > UINT64_MAX - seconds) {
    Stop();
    return;
  }
  now.tv_sec += seconds;
  expire_time_ = now;
}